

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_spectral_pairs_digital_filter.cc
# Opt level: O3

bool __thiscall
sptk::LineSpectralPairsDigitalFilter::Run
          (LineSpectralPairsDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer pdVar2;
  double *pdVar3;
  pointer pdVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  pointer pdVar8;
  size_type sVar9;
  uint num;
  double *pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if ((buffer != (Buffer *)0x0) && (bVar5 = false, filter_output != (double *)0x0)) {
    lVar6 = (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                  .super__Vector_impl_data._M_start;
    sVar9 = lVar6 >> 3;
    bVar5 = false;
    if (sVar9 == (long)this->num_filter_order_ + 1U) {
      if ((long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != lVar6) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d1_,sVar9);
        pdVar8 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar8 != pdVar2) {
          memset(pdVar8,0,((long)pdVar2 + (-8 - (long)pdVar8) & 0xfffffffffffffff8U) + 8);
        }
      }
      sVar9 = (long)this->num_filter_order_ + 1;
      if ((long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != sVar9) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d2_,sVar9);
        pdVar8 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar8 != pdVar2) {
          memset(pdVar8,0,((long)pdVar2 + (-8 - (long)pdVar8) & 0xfffffffffffffff8U) + 8);
        }
      }
      this_00 = &buffer->ab_;
      num = this->num_filter_order_;
      if ((long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)(int)num) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)(int)num);
        num = this->num_filter_order_;
      }
      pdVar10 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      dVar11 = filter_input * *pdVar10;
      if (num == 0) {
        *filter_output = dVar11;
      }
      else {
        pdVar10 = pdVar10 + 1;
        pdVar3 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar10 != pdVar3) {
          do {
            dVar12 = cos(*pdVar10);
            *pdVar8 = dVar12 * -2.0;
            pdVar10 = pdVar10 + 1;
            pdVar8 = pdVar8 + 1;
          } while (pdVar10 != pdVar3);
          pdVar8 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          num = this->num_filter_order_;
        }
        pdVar2 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar12 = *pdVar2;
        if (1 < (int)num) {
          dVar13 = *pdVar4;
          uVar7 = 1;
          do {
            pdVar2[uVar7] = pdVar8[uVar7 - 1] * dVar12 + pdVar2[uVar7];
            pdVar4[uVar7] = pdVar8[uVar7] * dVar13 + pdVar4[uVar7];
            pdVar2[uVar7 + 1] = dVar12 + pdVar2[uVar7 + 1];
            dVar13 = dVar13 + pdVar4[uVar7 + 1];
            pdVar4[uVar7 + 1] = dVar13;
            dVar12 = pdVar2[uVar7 + 1];
            dVar11 = dVar11 + pdVar2[uVar7] + pdVar4[uVar7];
            uVar7 = uVar7 + 2;
          } while (uVar7 < num);
        }
        bVar5 = IsEven(num);
        iVar1 = this->num_filter_order_;
        lVar6 = (long)iVar1;
        if (bVar5) {
          dVar12 = pdVar2[lVar6];
        }
        else {
          dVar12 = dVar12 * pdVar8[lVar6 + -1] + pdVar2[lVar6];
          pdVar2[lVar6] = dVar12;
        }
        dVar11 = dVar11 + (dVar12 - pdVar4[lVar6]);
        *filter_output = dVar11;
        if (0 < iVar1) {
          uVar7 = lVar6 + 1;
          do {
            pdVar2[uVar7 - 1] = pdVar2[uVar7 - 2];
            pdVar4[uVar7 - 1] = pdVar4[uVar7 - 2];
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        dVar11 = dVar11 * -0.5;
        *pdVar2 = dVar11;
        *pdVar4 = dVar11;
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool LineSpectralPairsDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output,
    LineSpectralPairsDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d1_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d1_.resize(num_filter_order_ + 1);
    std::fill(buffer->d1_.begin(), buffer->d1_.end(), 0.0);
  }
  if (buffer->d2_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d2_.resize(num_filter_order_ + 1);
    std::fill(buffer->d2_.begin(), buffer->d2_.end(), 0.0);
  }
  if (buffer->ab_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->ab_.resize(num_filter_order_);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  std::transform(filter_coefficients.begin() + 1, filter_coefficients.end(),
                 buffer->ab_.begin(),
                 [](double w) { return -2.0 * std::cos(w); });

  const double* ab(&(buffer->ab_[0]));
  double* d1(&buffer->d1_[0]);
  double* d2(&buffer->d2_[0]);

  // Apply LSP synthesis filter.
  double sum(gained_input);
  {
    double x1(d1[0]);
    double x2(d2[0]);
    for (int i(1); i < num_filter_order_; i += 2) {
      d1[i] += x1 * ab[i - 1];
      d2[i] += x2 * ab[i];
      d1[i + 1] += x1;
      d2[i + 1] += x2;
      x1 = d1[i + 1];
      x2 = d2[i + 1];
      sum += d1[i] + d2[i];
    }
    if (!sptk::IsEven(num_filter_order_)) {
      d1[num_filter_order_] += x1 * ab[num_filter_order_ - 1];
    }
    sum += d1[num_filter_order_] - d2[num_filter_order_];
  }

  // Save result.
  *filter_output = sum;

  // Shift stored signals.
  for (int i(num_filter_order_); 0 < i; --i) {
    d1[i] = d1[i - 1];
    d2[i] = d2[i - 1];
  }
  const double delayed_output(-0.5 * sum);
  d1[0] = delayed_output;
  d2[0] = delayed_output;

  return true;
}